

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# murmur_hash.hxx
# Opt level: O0

uint32_t murmur_hash(void *key,uint32_t length,uint32_t seed)

{
  int iVar1;
  uint uVar2;
  byte *pbVar3;
  uint local_54;
  uint local_50;
  uint i;
  uint32_t k;
  uint32_t h;
  uint8_t *tail;
  uint32_t *chunks;
  uint chunk_length;
  uint32_t n;
  uint32_t m;
  uint32_t r2;
  uint32_t r1;
  uint32_t c2;
  uint32_t c1;
  uint32_t seed_local;
  uint32_t length_local;
  void *key_local;
  
  pbVar3 = (byte *)((long)key + (ulong)((length >> 2) << 2));
  i = seed;
  for (local_54 = 0; local_54 < length >> 2; local_54 = local_54 + 1) {
    iVar1 = *(int *)((long)key + (ulong)local_54 * 4);
    uVar2 = (iVar1 * 0x16a88000 | (uint)(iVar1 * -0x3361d2af) >> 0x11) * 0x1b873593 ^ i;
    i = (uVar2 << 0xd | uVar2 >> 0x13) * 5 + 0xe6546b64;
  }
  local_50 = 0;
  uVar2 = length & 3;
  if (uVar2 != 1) {
    if (uVar2 != 2) {
      if (uVar2 != 3) goto LAB_0010313a;
      local_50 = (uint)pbVar3[2] << 0x10;
    }
    local_50 = (uint)pbVar3[1] << 8 ^ local_50;
  }
  i = ((*pbVar3 ^ local_50) * 0x16a88000 | (*pbVar3 ^ local_50) * -0x3361d2af >> 0x11) * 0x1b873593
      ^ i;
LAB_0010313a:
  uVar2 = ((length ^ i) >> 0x10 ^ length ^ i) * -0x7a143595;
  uVar2 = (uVar2 >> 0xd ^ uVar2) * -0x3d4d51cb;
  return uVar2 >> 0x10 ^ uVar2;
}

Assistant:

HLL_CONSTEXPR_OR_INLINE uint32_t murmur_hash(const void* key, uint32_t length, uint32_t seed) noexcept
{
    constexpr uint32_t c1 = 0xcc9e2d51;
    constexpr uint32_t c2 = 0x1b873593;
    constexpr uint32_t r1 = 15;
    constexpr uint32_t r2 = 13;
    constexpr uint32_t m = 5;
    constexpr uint32_t n = 0xe6546b64;
    const auto chunk_length = length / 4u;
    const auto chunks = static_cast<const uint32_t*>(key); // 32 bit extract from `key'
    const auto tail = static_cast<const uint8_t*>(key) + chunk_length * 4; // tail - last 8 bytes
    uint32_t h = 0;
    uint32_t k = 0;

    h = seed;

    // for each 4 byte chunk of `key'
    for (auto i = 0u; i < chunk_length; ++i)
    {
        // next 4 byte chunk of `key'
        k = chunks[i];

        // encode next 4 byte chunk of `key'
        k *= c1;
        k = (k << r1) | (k >> (32 - r1));
        k *= c2;

        // append to hash
        h ^= k;
        h = (h << r2) | (h >> (32 - r2));
        h = h * m + n;
    }

    k = 0;

    // remainder
    switch (length & 3u)
    { // `length % 4'
        case 3:
            k ^= (tail[2] << 16u);
        case 2:
            k ^= (tail[1] << 8u);

        case 1:
            k ^= tail[0];
            k *= c1;
            k = (k << r1) | (k >> (32 - r1));
            k *= c2;
            h ^= k;
    }

    h ^= length;

    h ^= (h >> 16u);
    h *= 0x85ebca6b;
    h ^= (h >> 13u);
    h *= 0xc2b2ae35;
    h ^= (h >> 16u);

    return h;
}